

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O0

void __thiscall helics::CoreApp::CoreApp(CoreApp *this,string_view argString)

{
  string_view name;
  bool bVar1;
  ParseOutput PVar2;
  size_type sVar3;
  element_type *peVar4;
  pointer this_00;
  __shared_ptr *in_RDI;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
  *in_stack_00000008;
  CoreApp *in_stack_00000010;
  CoreApp *in_stack_00000038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  helicsCLI11App *in_stack_00000050;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  
  CLI::std::shared_ptr<helics::Core>::shared_ptr((shared_ptr<helics::Core> *)0x44aa41);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
                     (char)((uint)in_stack_ffffffffffffff5c >> 0x18),0x44aa6a);
  if (sVar3 == 0xffffffffffffffff) {
    name._M_str = in_stack_ffffffffffffffa8;
    name._M_len = (size_t)in_stack_ffffffffffffffa0;
    CoreFactory::findCore(name);
    std::shared_ptr<helics::Core>::operator=
              ((shared_ptr<helics::Core> *)in_stack_ffffffffffffff60,
               (shared_ptr<helics::Core> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    CLI::std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x44aab9);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x44aad3);
      (*peVar4->_vptr_Core[0xc])();
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff60,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      return;
    }
  }
  generateParser(in_stack_00000038);
  this_00 = CLI::std::
            unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
            operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x44ab30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  PVar2 = helicsCLI11App::helics_parse<std::__cxx11::string>(in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_71);
  if (PVar2 == OK) {
    processArgs(in_stack_00000010,in_stack_00000008);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              in_stack_ffffffffffffff70);
  return;
}

Assistant:

CoreApp::CoreApp(std::string_view argString)
{
    if (argString.find_first_of('-') == std::string::npos) {
        core = CoreFactory::findCore(argString);
        if (core) {
            name = core->getIdentifier();
            return;
        }
    }
    auto app = generateParser();
    if (app->helics_parse(std::string{argString}) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}